

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int rngTest(char *filename,char *resul,char *errr,int options)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  glob_t globbuf;
  char err [500];
  char prefix [500];
  char pattern [500];
  int local_688;
  glob64_t local_670;
  char local_628 [499];
  undefined1 local_435;
  undefined1 local_428 [512];
  char local_228 [499];
  undefined1 local_35;
  
  pcVar3 = baseFilename(filename);
  pvVar4 = (void *)xmlRelaxNGNewParserCtxt(filename);
  xmlRelaxNGSetParserStructuredErrors(pvVar4,testStructuredErrorHandler,0);
  lVar5 = xmlRelaxNGParse(pvVar4);
  xmlRelaxNGFreeParserCtxt();
  if (lVar5 == 0) {
    testErrorHandler(pvVar4,"Relax-NG schema %s failed to compile\n",filename);
  }
  iVar1 = testErrorsSize;
  sVar6 = strlen(pcVar3);
  local_688 = -1;
  if (0xfffffe10 < (int)sVar6 - 500U) {
    uVar10 = (ulong)((int)sVar6 - 4);
    memcpy(local_428,pcVar3,uVar10);
    local_428[uVar10] = 0;
    local_688 = 0;
    iVar2 = snprintf(local_228,499,"./test/relaxng/%s_?.xml",local_428);
    if (0x1f2 < iVar2) {
      local_35 = 0;
    }
    local_670.gl_offs = 0;
    glob64(local_228,8,(__errfunc *)0x0,&local_670);
    if (local_670.gl_pathc != 0) {
      uVar10 = 0;
      local_688 = 0;
      do {
        testErrorsSize = iVar1;
        testErrors[iVar1] = '\0';
        pcVar3 = local_670.gl_pathv[uVar10];
        pcVar7 = baseFilename(pcVar3);
        sVar6 = strlen(pcVar7);
        iVar2 = (int)sVar6;
        if ((iVar2 < 7) || (pcVar7[iVar2 - 6] != '_')) {
          fprintf(_stderr,"don\'t know how to process %s\n",pcVar3);
        }
        else {
          iVar2 = snprintf(local_628,499,"result/relaxng/%s_%c.err",local_428,
                           (ulong)(uint)(int)pcVar7[iVar2 - 5]);
          if (0x1f2 < iVar2) {
            local_435 = 0;
          }
          if (lVar5 != 0) {
            nb_tests = nb_tests + 1;
            lVar8 = xmlReadFile(pcVar3,0,options);
            if (lVar8 == 0) {
              fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar3,filename);
              local_688 = -1;
            }
            else {
              pvVar9 = (void *)xmlRelaxNGNewValidCtxt(lVar5);
              xmlRelaxNGSetValidStructuredErrors(pvVar9,testStructuredErrorHandler,0);
              pvVar4 = pvVar9;
              iVar2 = xmlRelaxNGValidateDoc(pvVar9,lVar8);
              pcVar7 = "%s validation generated an internal error\n";
              if (0 < iVar2) {
                pcVar7 = "%s fails to validate\n";
              }
              if (iVar2 == 0) {
                pcVar7 = "%s validates\n";
              }
              testErrorHandler(pvVar4,pcVar7,pcVar3);
              xmlRelaxNGFreeValidCtxt(pvVar9);
              xmlFreeDoc(lVar8);
            }
          }
          iVar2 = compareFileMem(local_628,testErrors,testErrorsSize);
          if (iVar2 != 0) {
            fprintf(_stderr,"Error for %s on %s failed\n",pcVar3,filename);
            local_688 = 1;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < local_670.gl_pathc);
    }
    globfree64(&local_670);
  }
  xmlRelaxNGFree(lVar5);
  return local_688;
}

Assistant:

static int
rngTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlRelaxNGParserCtxtPtr ctxt;
    xmlRelaxNGPtr schemas;
    int res = 0, len, ret = 0;
    int parseErrorsSize;
    char pattern[500];
    char prefix[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlRelaxNGNewParserCtxt(filename);
    xmlRelaxNGSetParserStructuredErrors(ctxt, testStructuredErrorHandler,
                                        NULL);
    schemas = xmlRelaxNGParse(ctxt);
    xmlRelaxNGFreeParserCtxt(ctxt);
    if (schemas == NULL)
        testErrorHandler(NULL, "Relax-NG schema %s failed to compile\n",
                         filename);
    parseErrorsSize = testErrorsSize;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlRelaxNGFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .rng */
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/relaxng/%s_?.xml", prefix) >= 499)
        pattern[499] = 0;

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = parseErrorsSize;
        testErrors[parseErrorsSize] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    res = snprintf(err, 499, "result/relaxng/%s_%c.err",
		     prefix, count);
            if (res >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	if (schemas != NULL) {
	    nb_tests++;
	    res = rngOneTest(filename, instance, options, schemas);
	    if (res != 0)
		ret = res;
	}
        if (compareFileMem(err, testErrors, testErrorsSize)) {
            fprintf(stderr, "Error for %s on %s failed\n", instance,
                    filename);
            ret = 1;
        }
    }
    globfree(&globbuf);
    xmlRelaxNGFree(schemas);

    return(ret);
}